

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibCellProfile(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop,int nFanins,int *Perm,
                       int *pProf)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  if (pCellTop == (Mio_Cell2_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (int)pCellTop->Delays[InTop];
  }
  if (0 < nFanins) {
    uVar3 = 0;
    do {
      iVar4 = Perm[uVar3];
      uVar2 = *(uint *)&pCellBot->field_0x10 >> 0x1c;
      if (iVar4 < (int)uVar2) {
        iVar4 = (int)pCellBot->Delays[iVar4] + iVar1;
      }
      else {
        if (iVar4 < (int)(uVar2 + InTop)) {
          iVar4 = iVar4 - uVar2;
        }
        else {
          iVar4 = (iVar4 - uVar2) + 1;
        }
        iVar4 = (int)pCellTop->Delays[iVar4];
      }
      pProf[uVar3] = iVar4;
      uVar3 = uVar3 + 1;
    } while ((uint)nFanins != uVar3);
  }
  return;
}

Assistant:

void Sfm_LibCellProfile( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop, int nFanins, int * Perm, int * pProf )
{
    int i, DelayAdd = (int)(pCellTop ? pCellTop->Delays[InTop] : 0);
    for ( i = 0; i < nFanins; i++ )
        if ( Perm[i] < (int)pCellBot->nFanins )
            pProf[i] = (int)pCellBot->Delays[Perm[i]] + DelayAdd;
        else if ( Perm[i] < (int)pCellBot->nFanins + InTop )
            pProf[i] = (int)pCellTop->Delays[Perm[i] - (int)pCellBot->nFanins];
        else // if ( Perm[i] >= (int)pCellBot->nFanins + InTop )
            pProf[i] = (int)pCellTop->Delays[Perm[i] - (int)pCellBot->nFanins + 1];
}